

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_HRR_Algorithm_Base::HRRDoubletLoop_
          (OSTEI_HRR_Algorithm_Base *this,HRRDoubletStepList *hrrlist,DoubletSet *inittargets,
          DoubletSet *solveddoublets,DoubletSet *pruned,RRStepType steptype)

{
  bool bVar1;
  size_type sVar2;
  reference pDVar3;
  value_type *in_RCX;
  long *in_RDI;
  undefined4 in_R9D;
  pair<std::_Rb_tree_const_iterator<Doublet>,_bool> pVar4;
  HRRDoubletStep hrr;
  reverse_iterator it;
  DoubletSet newtargets;
  DoubletSet targets;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  _Rb_tree_const_iterator<Doublet> in_stack_fffffffffffffdc0;
  value_type *in_stack_fffffffffffffdc8;
  reference in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  _Rb_tree_const_iterator<Doublet> in_stack_fffffffffffffde0;
  undefined1 local_180 [36];
  RRStepType in_stack_fffffffffffffea4;
  DoubletSet *in_stack_fffffffffffffea8;
  DoubletSet *in_stack_fffffffffffffeb0;
  
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
             in_stack_fffffffffffffdc0._M_node,
             (set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
             CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  while (sVar2 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::size
                           ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134e69),
        sVar2 != 0) {
    std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
              ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x134e80);
    std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::rbegin
              ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    while( true ) {
      std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::rend
                ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                 CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      bVar1 = std::operator!=((reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_> *)
                              in_stack_fffffffffffffdc0._M_node,
                              (reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_> *)
                              CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      if (!bVar1) break;
      std::reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_>::operator*
                ((reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_> *)
                 in_stack_fffffffffffffdc0._M_node);
      sVar2 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::count
                        ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                         in_stack_fffffffffffffdd0,(key_type *)in_stack_fffffffffffffdc8);
      if (sVar2 == 0) {
        pDVar3 = std::reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_>::operator*
                           ((reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_> *)
                            in_stack_fffffffffffffdc0._M_node);
        (**(code **)(*in_RDI + 0x10))(local_180,in_RDI,pDVar3,in_R9D);
        std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back
                  ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                   in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        std::array<Doublet,_2UL>::operator[]
                  ((array<Doublet,_2UL> *)in_stack_fffffffffffffdc0._M_node,
                   CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
        sVar2 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::count
                          ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                           in_stack_fffffffffffffdd0,(key_type *)in_stack_fffffffffffffdc8);
        if (sVar2 == 0) {
          std::array<Doublet,_2UL>::operator[]
                    ((array<Doublet,_2UL> *)in_stack_fffffffffffffdc0._M_node,
                     CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
          std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::insert
                    ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                     in_stack_fffffffffffffde0._M_node,
                     (value_type *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        }
        std::array<Doublet,_2UL>::operator[]
                  ((array<Doublet,_2UL> *)in_stack_fffffffffffffdc0._M_node,
                   CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
        sVar2 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::count
                          ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                           in_stack_fffffffffffffdd0,(key_type *)in_stack_fffffffffffffdc8);
        if (sVar2 == 0) {
          std::array<Doublet,_2UL>::operator[]
                    ((array<Doublet,_2UL> *)in_stack_fffffffffffffdc0._M_node,
                     CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
          pVar4 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::insert
                            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                             in_stack_fffffffffffffde0._M_node,
                             (value_type *)
                             CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
          in_stack_fffffffffffffde0 = pVar4.first._M_node;
          in_stack_fffffffffffffddf = pVar4.second;
        }
        in_stack_fffffffffffffdc8 = in_RCX;
        in_stack_fffffffffffffdd0 =
             std::reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_>::operator*
                       ((reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_> *)
                        in_stack_fffffffffffffdc0._M_node);
        pVar4 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::insert
                          ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
                           in_stack_fffffffffffffde0._M_node,
                           (value_type *)
                           CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        in_stack_fffffffffffffdc0 = pVar4.first._M_node;
        in_stack_fffffffffffffdbf = pVar4.second;
        HRRDoubletStep::~HRRDoubletStep((HRRDoubletStep *)in_stack_fffffffffffffdc0._M_node);
      }
      std::reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_>::operator++
                ((reverse_iterator<std::_Rb_tree_const_iterator<Doublet>_> *)
                 in_stack_fffffffffffffdc0._M_node);
    }
    PruneDoublets_(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::operator=
              ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
               in_stack_fffffffffffffdc0._M_node,
               (set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
              ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x135174);
  }
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::~set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x1351a2);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::HRRDoubletLoop_(HRRDoubletStepList & hrrlist,
                                               const DoubletSet & inittargets,
                                               DoubletSet & solveddoublets,
                                               DoubletSet & pruned,
                                               RRStepType steptype)
{
    DoubletSet targets = inittargets;

    while(targets.size())
    {
        DoubletSet newtargets;

        for(auto it = targets.rbegin(); it != targets.rend(); ++it)
        {
            // skip if done alread
            // this can happen with some of the more complex trees
            if(solveddoublets.count(*it) > 0)
                continue;

            HRRDoubletStep hrr = this->DoubletStep_(*it, steptype);
            hrrlist.push_back(hrr);

            if(solveddoublets.count(hrr.src[0]) == 0)
                newtargets.insert(hrr.src[0]);
            if(solveddoublets.count(hrr.src[1]) == 0)
                newtargets.insert(hrr.src[1]);
            
            solveddoublets.insert(*it);
        }

        //cout << "Generated " << newtargets.size() << " new targets\n";

        PruneDoublets_(newtargets, pruned, steptype);

        //cout << "After pruning: " << newtargets.size() << " new targets\n";
        //for(const auto & it : newtargets)
        //    std::cout << "    " << it << "\n";

        targets = newtargets;
    } 

}